

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

string * SetPropertyCommand::MakeSourceFilePathAbsoluteIfNeeded
                   (string *__return_storage_ptr__,cmExecutionStatus *status,
                   string *source_file_path,bool needed)

{
  cmMakefile *this;
  string *in_base;
  bool needed_local;
  string *source_file_path_local;
  cmExecutionStatus *status_local;
  string *absolute_file_path;
  
  if (needed) {
    this = cmExecutionStatus::GetMakefile(status);
    in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
    cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,source_file_path,in_base);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)source_file_path);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MakeSourceFilePathAbsoluteIfNeeded(
  cmExecutionStatus& status, const std::string& source_file_path,
  const bool needed)
{
  if (!needed) {
    return source_file_path;
  }
  std::string absolute_file_path = cmSystemTools::CollapseFullPath(
    source_file_path, status.GetMakefile().GetCurrentSourceDirectory());
  return absolute_file_path;
}